

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

bool __thiscall ON_3dmPageSettings::IsValid(ON_3dmPageSettings *this,ON_TextLog *text_log)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  dVar1 = this->m_width_mm;
  if ((((dVar1 != 0.0) || (NAN(dVar1))) || (this->m_height_mm != 0.0)) || (NAN(this->m_height_mm)))
  {
    bVar4 = ON_IsValid(dVar1);
    bVar5 = 0.0 < this->m_width_mm;
    bVar6 = bVar5 && bVar4;
    if (text_log != (ON_TextLog *)0x0 && (!bVar5 || !bVar4)) {
      ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_width_mm = %g (should be > 0.0).\n");
    }
    bVar5 = ON_IsValid(this->m_height_mm);
    if ((!bVar5) || (this->m_height_mm <= 0.0)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_height_mm = %g (should be > 0.0).\n");
      }
      bVar6 = false;
    }
    bVar5 = ON_IsValid(this->m_top_margin_mm);
    if ((!bVar5) || (this->m_top_margin_mm < 0.0)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_3dmPageSettings has m_top_margin_mm = %g (should be >= 0.0).\n");
      }
      bVar6 = false;
    }
    bVar5 = ON_IsValid(this->m_bottom_margin_mm);
    if ((!bVar5) || (this->m_bottom_margin_mm < 0.0)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_3dmPageSettings has m_bottom_margin_mm = %g (should be >= 0.0).\n");
      }
      bVar6 = false;
    }
    bVar5 = ON_IsValid(this->m_left_margin_mm);
    if ((!bVar5) || (this->m_left_margin_mm < 0.0)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_3dmPageSettings has m_left_margin_mm = %g (should be >= 0.0).\n");
      }
      bVar6 = false;
    }
    bVar5 = ON_IsValid(this->m_right_margin_mm);
    if ((!bVar5) || (this->m_right_margin_mm < 0.0)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_3dmPageSettings has m_right_margin_mm = %g (should be >= 0.0).\n");
      }
      bVar6 = false;
    }
    if (this->m_width_mm <= this->m_left_margin_mm + this->m_right_margin_mm) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_3dmPageSettings has m_left_margin_mm+m_right_margin_mm = %g > %g = m_width_mm.\n"
                         );
      }
      bVar6 = false;
    }
    if (this->m_top_margin_mm + this->m_bottom_margin_mm < this->m_height_mm) {
      return bVar6;
    }
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,
                        "ON_3dmPageSettings has m_top_margin_mm+m_bottom_margin_mm = %g > %g = m_height_mm.\n"
                       );
    }
  }
  else {
    dVar1 = this->m_top_margin_mm;
    if ((text_log != (ON_TextLog *)0x0) && ((dVar1 != 0.0 || (NAN(dVar1))))) {
      ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_top_margin_mm = %g (should be 0.0).\n");
    }
    dVar2 = this->m_bottom_margin_mm;
    bVar5 = dVar2 != 0.0;
    if (text_log != (ON_TextLog *)0x0 && bVar5) {
      ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_bottom_margin_mm = %g (should be 0.0).\n"
                       );
    }
    dVar3 = this->m_left_margin_mm;
    bVar4 = dVar3 != 0.0;
    if (text_log != (ON_TextLog *)0x0 && bVar4) {
      ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_left_margin_mm = %g (should be 0.0).\n");
    }
    bVar6 = this->m_right_margin_mm == 0.0;
    if (text_log == (ON_TextLog *)0x0 || bVar6) {
      return ((text_log == (ON_TextLog *)0x0 || (NAN(dVar3) || !bVar4) && !NAN(dVar3)) &&
             (((text_log == (ON_TextLog *)0x0 || (NAN(dVar2) || !bVar5) && !NAN(dVar2)) &&
              (dVar1 == 0.0 && dVar2 == 0.0)) && dVar3 == 0.0)) && bVar6;
    }
    ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_right_margin_mm = %g (should be 0.0).\n");
  }
  return false;
}

Assistant:

bool ON_3dmPageSettings::IsValid( ON_TextLog* text_log ) const
{
  bool rc = true;

  if ( m_width_mm != 0.0 || m_height_mm != 0.0 )
  {
    if ( !ON_IsValid(m_width_mm) || m_width_mm <= 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_width_mm = %g (should be > 0.0).\n",m_width_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_height_mm) || m_height_mm <= 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_height_mm = %g (should be > 0.0).\n",m_height_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_top_margin_mm) || m_top_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_top_margin_mm = %g (should be >= 0.0).\n",m_top_margin_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_bottom_margin_mm) || m_bottom_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_bottom_margin_mm = %g (should be >= 0.0).\n",m_bottom_margin_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_left_margin_mm) || m_left_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_left_margin_mm = %g (should be >= 0.0).\n",m_left_margin_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_right_margin_mm) || m_right_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_right_margin_mm = %g (should be >= 0.0).\n",m_right_margin_mm);
      }
      rc = false;
    }
    if ( m_left_margin_mm + m_right_margin_mm >= m_width_mm )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_left_margin_mm+m_right_margin_mm = %g > %g = m_width_mm.\n",m_left_margin_mm + m_right_margin_mm, m_width_mm);
      }
      rc = false;
    }
    if ( m_top_margin_mm + m_bottom_margin_mm >= m_height_mm )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_top_margin_mm+m_bottom_margin_mm = %g > %g = m_height_mm.\n",m_top_margin_mm + m_bottom_margin_mm, m_height_mm);
      }
      rc = false;
    }
  }
  else
  {
    if ( m_top_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_top_margin_mm = %g (should be 0.0).\n",m_top_margin_mm);
      }
      rc = false;
    }
    if ( m_bottom_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_bottom_margin_mm = %g (should be 0.0).\n",m_bottom_margin_mm);
      }
      rc = false;
    }
    if ( m_left_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_left_margin_mm = %g (should be 0.0).\n",m_left_margin_mm);
      }
      rc = false;
    }
    if ( m_right_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_right_margin_mm = %g (should be 0.0).\n",m_right_margin_mm);
      }
      rc = false;
    }
  }

  return rc;
}